

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O3

BOOL __thiscall LASinterval::get_merged_cell(LASinterval *this)

{
  LASintervalStartCell *pLVar1;
  U32 UVar2;
  
  pLVar1 = this->merged_cells;
  if (pLVar1 != (LASintervalStartCell *)0x0) {
    UVar2 = pLVar1->total;
    this->full = pLVar1->full;
    this->total = UVar2;
    this->current_cell = &pLVar1->super_LASintervalCell;
  }
  return pLVar1 != (LASintervalStartCell *)0x0;
}

Assistant:

BOOL LASinterval::get_merged_cell()
{
  if (merged_cells)
  {
    full = merged_cells->full;
    total = merged_cells->total;
    current_cell = merged_cells;
    return TRUE;
  }
  return FALSE;
}